

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

int setup_sparse(archive_read_disk *a,archive_entry *entry,int *fd)

{
  mode_t mVar1;
  int iVar2;
  wchar_t wVar3;
  la_int64_t lVar4;
  char *pcVar5;
  __off_t _Var6;
  int *piVar7;
  bool bVar8;
  char *local_58;
  char *path;
  int check_fully_sparse;
  int exit_sts;
  off_t off_e;
  off_t off_s;
  off_t initial_off;
  int64_t size;
  int *fd_local;
  archive_entry *entry_local;
  archive_read_disk *a_local;
  
  path._4_4_ = 0;
  bVar8 = false;
  mVar1 = archive_entry_filetype(entry);
  if (((mVar1 != 0x8000) || (lVar4 = archive_entry_size(entry), lVar4 < 1)) ||
     (pcVar5 = archive_entry_hardlink(entry), pcVar5 != (char *)0x0)) {
    return 0;
  }
  if (*fd < 0) {
    local_58 = archive_read_disk_entry_setup_path(a,entry,fd);
  }
  else {
    local_58 = (char *)0x0;
  }
  if (*fd < 0) {
    if (local_58 == (char *)0x0) {
      return -0x19;
    }
    iVar2 = open(local_58,0x80800);
    *fd = iVar2;
    if (*fd < 0) {
      piVar7 = __errno_location();
      archive_set_error(&a->archive,*piVar7,"Can\'t open `%s\'",local_58);
      return -0x19;
    }
    __archive_ensure_cloexec_flag(*fd);
    off_s = 0;
  }
  else {
    off_s = lseek(*fd,0,1);
    if (off_s != 0) {
      lseek(*fd,0,0);
    }
  }
  _Var6 = lseek(*fd,0,4);
  if (_Var6 < 0) {
    a_local._4_4_ = setup_sparse_fiemap(a,entry,fd);
  }
  else {
    if (0 < _Var6) {
      lseek(*fd,0,0);
    }
    off_e = 0;
    lVar4 = archive_entry_size(entry);
    while (off_e < lVar4) {
      _Var6 = lseek(*fd,off_e,3);
      if (_Var6 == -1) {
        piVar7 = __errno_location();
        if (*piVar7 != 6) {
          piVar7 = __errno_location();
          archive_set_error(&a->archive,*piVar7,"lseek(SEEK_HOLE) failed");
          path._4_4_ = -0x19;
          goto LAB_00b67068;
        }
        wVar3 = archive_entry_sparse_count(entry);
        bVar8 = wVar3 == L'\0';
        break;
      }
      off_e = lseek(*fd,_Var6,4);
      if (off_e == -1) {
        piVar7 = __errno_location();
        if ((*piVar7 != 6) || (_Var6 = lseek(*fd,0,2), _Var6 == -1)) {
          piVar7 = __errno_location();
          archive_set_error(&a->archive,*piVar7,"lseek(SEEK_DATA) failed");
          path._4_4_ = -0x19;
          goto LAB_00b67068;
        }
        break;
      }
      if ((_Var6 == 0) && (off_e == lVar4)) break;
      archive_entry_sparse_add_entry(entry,_Var6,off_e - _Var6);
    }
    if (((bVar8) && (_Var6 = lseek(*fd,0,4), _Var6 == 0)) &&
       (_Var6 = lseek(*fd,0,2), _Var6 == lVar4)) {
      archive_entry_sparse_add_entry(entry,0,0);
    }
LAB_00b67068:
    lseek(*fd,off_s,0);
    a_local._4_4_ = path._4_4_;
  }
  return a_local._4_4_;
}

Assistant:

static int
setup_sparse(struct archive_read_disk *a, struct archive_entry *entry)
{
	struct tree *t = a->tree;
	int64_t length, offset;
	int i;

	t->sparse_count = archive_entry_sparse_reset(entry);
	if (t->sparse_count+1 > t->sparse_list_size) {
		free(t->sparse_list);
		t->sparse_list_size = t->sparse_count + 1;
		t->sparse_list = malloc(sizeof(t->sparse_list[0]) *
		    t->sparse_list_size);
		if (t->sparse_list == NULL) {
			t->sparse_list_size = 0;
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate data");
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	for (i = 0; i < t->sparse_count; i++) {
		archive_entry_sparse_next(entry, &offset, &length);
		t->sparse_list[i].offset = offset;
		t->sparse_list[i].length = length;
	}
	if (i == 0) {
		t->sparse_list[i].offset = 0;
		t->sparse_list[i].length = archive_entry_size(entry);
	} else {
		t->sparse_list[i].offset = archive_entry_size(entry);
		t->sparse_list[i].length = 0;
	}
	t->current_sparse = t->sparse_list;

	return (ARCHIVE_OK);
}